

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O0

shared_ptr<const_ON_Mesh> * __thiscall
ON_BrepFace::UniqueMesh(ON_BrepFace *this,mesh_type mesh_type)

{
  mesh_type mt;
  bool bVar1;
  long lVar2;
  undefined1 local_38 [24];
  shared_ptr<const_ON_Mesh> *sp;
  ON_BrepFace *pOStack_18;
  mesh_type mesh_type_local;
  ON_BrepFace *this_local;
  
  sp._4_4_ = mesh_type;
  pOStack_18 = this;
  local_38._16_8_ = SharedMesh(this,mesh_type);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_38._16_8_);
  if ((bVar1) &&
     (lVar2 = std::__shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>::use_count
                        ((__shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2> *)local_38._16_8_)
     , mt = sp._4_4_, 1 < lVar2)) {
    std::__shared_ptr_access<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
              ((__shared_ptr_access<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               local_38._16_8_);
    std::make_shared<ON_Mesh_const,ON_Mesh_const&>((ON_Mesh *)local_38);
    SetMesh(this,mt,(shared_ptr<const_ON_Mesh> *)local_38);
    std::shared_ptr<const_ON_Mesh>::~shared_ptr((shared_ptr<const_ON_Mesh> *)local_38);
    this_local = (ON_BrepFace *)SharedMesh(this,sp._4_4_);
  }
  else {
    this_local = (ON_BrepFace *)local_38._16_8_;
  }
  return (shared_ptr<const_ON_Mesh> *)this_local;
}

Assistant:

const std::shared_ptr<const ON_Mesh>& ON_BrepFace::UniqueMesh(ON::mesh_type mesh_type)
{
  const auto& sp = SharedMesh(mesh_type);

  if (sp && sp.use_count() > 1)
  {
    SetMesh(mesh_type, std::make_shared<const ON_Mesh>(*sp));
    return SharedMesh(mesh_type);
  }

  return sp;
}